

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

string * __thiscall
deqp::gls::DrawTestSpec::getName_abi_cxx11_(string *__return_storage_ptr__,DrawTestSpec *this)

{
  AttributeSpec *pAVar1;
  MethodInfo MVar2;
  AttributeSpec *pAVar3;
  size_type sVar4;
  ostream *poVar5;
  Storage extraout_EDX;
  Storage extraout_EDX_00;
  Storage storage;
  InputType type;
  OutputType type_00;
  InputType type_01;
  OutputType type_02;
  Usage usage;
  IndexType type_03;
  Storage storage_00;
  char *pcVar6;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  const_reference local_1c0;
  AttributeSpec *attrib;
  size_t ndx;
  stringstream name;
  ostream local_1a0 [382];
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  undefined4 local_1e;
  bool indexed;
  bool ranged;
  bool instanced;
  bool hasFirst;
  MethodInfo methodInfo;
  DrawTestSpec *this_local;
  
  _instanced = this;
  MVar2 = anon_unknown_1::getMethodInfo(this->drawMethod);
  _indexed = MVar2._4_2_;
  local_1e._3_1_ = MVar2.first;
  local_1f = local_1e._3_1_ & 1;
  local_1e._1_1_ = MVar2.instanced;
  local_20 = local_1e._1_1_ & 1;
  local_1e._2_1_ = MVar2.ranged;
  local_21 = local_1e._2_1_ & 1;
  local_1e._0_1_ = MVar2.indexed;
  local_22 = local_1e._0_1_ & 1;
  local_1e = MVar2._0_4_;
  std::__cxx11::stringstream::stringstream((stringstream *)&ndx);
  for (attrib = (AttributeSpec *)0x0; pAVar1 = attrib,
      pAVar3 = (AttributeSpec *)
               std::
               vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ::size(&this->attribs), pAVar1 < pAVar3;
      attrib = (AttributeSpec *)((long)&attrib->inputType + 1)) {
    local_1c0 = std::
                vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                ::operator[](&this->attribs,(size_type)attrib);
    sVar4 = std::
            vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
            ::size(&this->attribs);
    if (1 < sVar4) {
      poVar5 = std::operator<<(local_1a0,"attrib");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,(ulong)attrib);
      std::operator<<(poVar5,"_");
    }
    if ((attrib == (AttributeSpec *)0x0) || ((local_1c0->additionalPositionAttribute & 1U) != 0)) {
      std::operator<<(local_1a0,"pos_");
      storage = extraout_EDX;
    }
    else {
      std::operator<<(local_1a0,"col_");
      storage = extraout_EDX_00;
    }
    if ((local_1c0->useDefaultAttribute & 1U) == 0) {
      storageToString_abi_cxx11_(&local_230,(DrawTestSpec *)(ulong)local_1c0->storage,storage);
      poVar5 = std::operator<<(local_1a0,(string *)&local_230);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c0->offset);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c0->stride);
      poVar5 = std::operator<<(poVar5,"_");
      inputTypeToString_abi_cxx11_(&local_250,(DrawTestSpec *)(ulong)local_1c0->inputType,type_01);
      std::operator<<(poVar5,(string *)&local_250);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_230);
      if ((local_1c0->inputType != INPUTTYPE_UNSIGNED_INT_2_10_10_10) &&
         (local_1c0->inputType != INPUTTYPE_INT_2_10_10_10)) {
        std::ostream::operator<<(local_1a0,local_1c0->componentCount);
      }
      poVar5 = std::operator<<(local_1a0,"_");
      pcVar6 = "";
      if ((local_1c0->normalize & 1U) != 0) {
        pcVar6 = "normalized_";
      }
      poVar5 = std::operator<<(poVar5,pcVar6);
      outputTypeToString_abi_cxx11_(&local_270,(DrawTestSpec *)(ulong)local_1c0->outputType,type_02)
      ;
      poVar5 = std::operator<<(poVar5,(string *)&local_270);
      poVar5 = std::operator<<(poVar5,"_");
      usageTypeToString_abi_cxx11_(&local_290,(DrawTestSpec *)(ulong)local_1c0->usage,usage);
      poVar5 = std::operator<<(poVar5,(string *)&local_290);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c0->instanceDivisor);
      std::operator<<(poVar5,"_");
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)&local_270);
    }
    else {
      poVar5 = std::operator<<(local_1a0,"non_array_");
      inputTypeToString_abi_cxx11_(&local_1f0,(DrawTestSpec *)(ulong)local_1c0->inputType,type);
      poVar5 = std::operator<<(poVar5,(string *)&local_1f0);
      poVar5 = std::operator<<(poVar5,"_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1c0->componentCount);
      poVar5 = std::operator<<(poVar5,"_");
      outputTypeToString_abi_cxx11_(&local_210,(DrawTestSpec *)(ulong)local_1c0->outputType,type_00)
      ;
      poVar5 = std::operator<<(poVar5,(string *)&local_210);
      std::operator<<(poVar5,"_");
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
  }
  if ((local_22 & 1) != 0) {
    poVar5 = std::operator<<(local_1a0,"index_");
    indexTypeToString_abi_cxx11_(&local_2b0,(DrawTestSpec *)(ulong)this->indexType,type_03);
    poVar5 = std::operator<<(poVar5,(string *)&local_2b0);
    poVar5 = std::operator<<(poVar5,"_");
    storageToString_abi_cxx11_(&local_2d0,(DrawTestSpec *)(ulong)this->indexStorage,storage_00);
    poVar5 = std::operator<<(poVar5,(string *)&local_2d0);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = std::operator<<(poVar5,"offset");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexPointerOffset);
    std::operator<<(poVar5,"_");
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
  }
  if ((local_1f & 1) != 0) {
    poVar5 = std::operator<<(local_1a0,"first");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->first);
    std::operator<<(poVar5,"_");
  }
  if ((local_21 & 1) != 0) {
    poVar5 = std::operator<<(local_1a0,"ranged_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexMin);
    poVar5 = std::operator<<(poVar5,"_");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->indexMax);
    std::operator<<(poVar5,"_");
  }
  if ((local_20 & 1) != 0) {
    poVar5 = std::operator<<(local_1a0,"instances");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,this->instanceCount);
    std::operator<<(poVar5,"_");
  }
  switch(this->primitive) {
  case PRIMITIVE_POINTS:
    std::operator<<(local_1a0,"points_");
    break;
  case PRIMITIVE_TRIANGLES:
    std::operator<<(local_1a0,"triangles_");
    break;
  case PRIMITIVE_TRIANGLE_FAN:
    std::operator<<(local_1a0,"triangle_fan_");
    break;
  case PRIMITIVE_TRIANGLE_STRIP:
    std::operator<<(local_1a0,"triangle_strip_");
    break;
  case PRIMITIVE_LINES:
    std::operator<<(local_1a0,"lines_");
    break;
  case PRIMITIVE_LINE_STRIP:
    std::operator<<(local_1a0,"line_strip_");
    break;
  case PRIMITIVE_LINE_LOOP:
    std::operator<<(local_1a0,"line_loop_");
    break;
  case PRIMITIVE_LINES_ADJACENCY:
    std::operator<<(local_1a0,"line_adjancency");
    break;
  case PRIMITIVE_LINE_STRIP_ADJACENCY:
    std::operator<<(local_1a0,"line_strip_adjancency");
    break;
  case PRIMITIVE_TRIANGLES_ADJACENCY:
    std::operator<<(local_1a0,"triangles_adjancency");
    break;
  case PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
    std::operator<<(local_1a0,"triangle_strip_adjancency");
  }
  std::ostream::operator<<(local_1a0,this->primitiveCount);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ndx);
  return __return_storage_ptr__;
}

Assistant:

std::string DrawTestSpec::getName (void) const
{
	const MethodInfo	methodInfo	= getMethodInfo(drawMethod);
	const bool			hasFirst	= methodInfo.first;
	const bool			instanced	= methodInfo.instanced;
	const bool			ranged		= methodInfo.ranged;
	const bool			indexed		= methodInfo.indexed;

	std::stringstream name;

	for (size_t ndx = 0; ndx < attribs.size(); ++ndx)
	{
		const AttributeSpec& attrib = attribs[ndx];

		if (attribs.size() > 1)
			name << "attrib" << ndx << "_";

		if (ndx == 0|| attrib.additionalPositionAttribute)
			name << "pos_";
		else
			name << "col_";

		if (attrib.useDefaultAttribute)
		{
			name
				<< "non_array_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType) << "_"
				<< attrib.componentCount << "_"
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_";
		}
		else
		{
			name
				<< DrawTestSpec::storageToString(attrib.storage) << "_"
				<< attrib.offset << "_"
				<< attrib.stride << "_"
				<< DrawTestSpec::inputTypeToString((DrawTestSpec::InputType)attrib.inputType);
			if (attrib.inputType != DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10 && attrib.inputType != DrawTestSpec::INPUTTYPE_INT_2_10_10_10)
				name << attrib.componentCount;
			name
				<< "_"
				<< (attrib.normalize ? "normalized_" : "")
				<< DrawTestSpec::outputTypeToString(attrib.outputType) << "_"
				<< DrawTestSpec::usageTypeToString(attrib.usage) << "_"
				<< attrib.instanceDivisor << "_";
		}
	}

	if (indexed)
		name
			<< "index_" << DrawTestSpec::indexTypeToString(indexType) << "_"
			<< DrawTestSpec::storageToString(indexStorage) << "_"
			<< "offset" << indexPointerOffset << "_";
	if (hasFirst)
		name << "first" << first << "_";
	if (ranged)
		name << "ranged_" << indexMin << "_" << indexMax << "_";
	if (instanced)
		name << "instances" << instanceCount << "_";

	switch (primitive)
	{
		case DrawTestSpec::PRIMITIVE_POINTS:
			name << "points_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES:
			name << "triangles_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_FAN:
			name << "triangle_fan_";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP:
			name << "triangle_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES:
			name << "lines_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP:
			name << "line_strip_";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_LOOP:
			name << "line_loop_";
			break;
		case DrawTestSpec::PRIMITIVE_LINES_ADJACENCY:
			name << "line_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_LINE_STRIP_ADJACENCY:
			name << "line_strip_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLES_ADJACENCY:
			name << "triangles_adjancency";
			break;
		case DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP_ADJACENCY:
			name << "triangle_strip_adjancency";
			break;
		default:
			DE_ASSERT(false);
			break;
	}

	name << primitiveCount;

	return name.str();
}